

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Chapters::~Chapters(Chapters *this)

{
  int iVar1;
  
  iVar1 = this->m_editions_count;
  while (0 < iVar1) {
    this->m_editions_count = iVar1 - 1U;
    Edition::Clear(this->m_editions + (iVar1 - 1U));
    iVar1 = this->m_editions_count;
  }
  if (this->m_editions != (Edition *)0x0) {
    operator_delete__(&this->m_editions[-1].m_atoms_size);
    return;
  }
  return;
}

Assistant:

Chapters::~Chapters() {
  while (m_editions_count > 0) {
    Edition& e = m_editions[--m_editions_count];
    e.Clear();
  }
  delete[] m_editions;
}